

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::FillPrefixesUserRegistry(cmFindPackageCommand *this)

{
  char *pcVar1;
  mapped_type *outPaths;
  string dir;
  allocator local_31;
  string local_30;
  
  pcVar1 = cmsys::SystemTools::GetEnv("HOME");
  if (pcVar1 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
    std::__cxx11::string::append((char *)&local_30);
    std::__cxx11::string::append((string *)&local_30);
    outPaths = std::
               map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
               ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                            &PathLabel::UserRegistry.super_PathLabel);
    LoadPackageRegistryDir(this,&local_30,outPaths);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesUserRegistry()
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LoadPackageRegistryWinUser();
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) ==
      B_OK)
    {
    std::string fname = dir;
    fname += "/cmake/packages/";
    fname += Name;
    this->LoadPackageRegistryDir(fname,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
    }
#else
  if(const char* home = cmSystemTools::GetEnv("HOME"))
    {
    std::string dir = home;
    dir += "/.cmake/packages/";
    dir += this->Name;
    this->LoadPackageRegistryDir(dir,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
    }
#endif
}